

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

BCIns * lj_snap_restore(jit_State *J,void *exptr)

{
  byte *pbVar1;
  IRIns *pIVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  CTypeID id;
  SnapShot *pSVar6;
  SnapEntry *pSVar7;
  lua_State *L;
  IRIns *pIVar8;
  GCtab *pGVar9;
  IRIns *pIVar10;
  CTInfo info;
  uint uVar11;
  SnapShot *pSVar12;
  TValue *pTVar13;
  GCcdata *pGVar14;
  GCtab *pGVar15;
  IRIns *pIVar16;
  IRIns *pIVar17;
  uint uVar18;
  IRIns *pIVar19;
  ulong uVar20;
  uint8_t *puVar21;
  undefined4 uVar22;
  ExitState *ex;
  byte bVar23;
  BloomFilter rfilt;
  uint ref;
  IRRef2 IVar24;
  jit_State *J_00;
  IRIns *pIVar25;
  uint32_t uVar26;
  CTState *cts;
  ulong uVar27;
  CTSize sz;
  TValue *in_stack_ffffffffffffff38;
  CTSize in_stack_ffffffffffffff40;
  CTSize local_8c;
  lua_State *local_88;
  TValue *local_80;
  GCtab *local_78;
  ulong local_70;
  uint32_t local_64;
  SnapShot *local_60;
  long local_58;
  uint32_t *local_50;
  TValue local_48;
  BCIns *local_40;
  IRIns *local_38;
  
  uVar5 = J->exitno;
  ex = (ExitState *)(ulong)uVar5;
  J_00 = (jit_State *)(ulong)J->trace[J->parent].gcptr32;
  pSVar6 = (J_00->cur).snap;
  local_58 = (long)ex * 3;
  local_60 = pSVar6 + (long)ex;
  local_70 = (ulong)local_60->nent;
  pSVar7 = (J_00->cur).snapmap;
  uVar18 = local_60->mapofs;
  pSVar12 = (SnapShot *)&(J_00->cur).nsnapmap;
  if (pSVar6 + (long)((long)ex->fpr + 1) != pSVar6 + (J_00->cur).nsnap) {
    pSVar12 = pSVar6 + (long)((long)ex->fpr + 1);
  }
  pIVar19 = (J_00->cur).ir;
  uVar27 = (ulong)((J_00->cur).nins - 1);
  if (*(char *)((long)pIVar19 + uVar27 * 8 + 5) == '\x14') {
    pIVar19 = pIVar19 + uVar27;
    rfilt = 0;
    do {
      if ((pIVar19->field_0).op2 <= uVar5) {
        rfilt = rfilt | 1L << ((ulong)*(byte *)pIVar19 & 0x3f);
      }
      pbVar1 = (byte *)((long)pIVar19 + -3);
      pIVar19 = pIVar19 + -1;
    } while (*pbVar1 == 0x14);
  }
  else {
    rfilt = 0;
  }
  uVar26 = pSVar12->mapofs;
  local_40 = (BCIns *)(ulong)pSVar7[uVar18 + local_70];
  L = J->L;
  *(SnapEntry *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x1c) = pSVar7[uVar18 + local_70] + 4;
  pTVar13 = L->base;
  bVar23 = local_60->topslot;
  local_88 = L;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar13 + bVar23) {
    L->top = pTVar13 + *(byte *)((ulong)*(uint *)((ulong)pTVar13[-1].u32.lo + 0x10) - 0x39);
    lj_state_growstack(L,(uint)bVar23 -
                         (uint)*(byte *)((ulong)*(uint *)((ulong)pTVar13[-1].u32.lo + 0x10) - 0x39))
    ;
    pTVar13 = L->base;
  }
  local_80 = pTVar13 + -1;
  if (local_70 != 0) {
    local_50 = pSVar7 + (uVar26 - 1);
    local_64 = *(uint32_t *)((long)pTVar13 + -4);
    uVar27 = 0;
    do {
      uVar11 = pSVar7[uVar18 + uVar27];
      pGVar9 = local_78;
      pIVar19 = local_38;
      if ((uVar11 >> 0x12 & 1) == 0) {
        pTVar13 = local_80 + (uVar11 >> 0x18);
        ref = uVar11 & 0xffff;
        pIVar8 = (J_00->cur).ir;
        if (*(char *)((long)pIVar8 + (ulong)ref * 8 + 6) == -3) {
          if (uVar27 != 0) {
            uVar20 = 0;
            do {
              if ((pSVar7[uVar18 + uVar20] & 0xffff) == ref) {
                *pTVar13 = local_80[pSVar7[uVar18 + uVar20] >> 0x18];
                goto LAB_00146b88;
              }
              uVar20 = uVar20 + 1;
            } while (uVar27 != uVar20);
          }
          pIVar2 = pIVar8 + ref;
          if ((pIVar2->field_1).o - 0x51 < 2) {
            cts = (CTState *)(ulong)*(uint *)((ulong)(J->L->glref).ptr32 + 0x194);
            cts->L = J->L;
            id = pIVar8[(pIVar2->field_0).op1].field_1.op12;
            info = lj_ctype_info(cts,id,&local_8c);
            pGVar14 = lj_cdata_newx(cts,id,local_8c,info);
            uVar26 = (uint32_t)pGVar14;
            (pTVar13->u32).lo = uVar26;
            (pTVar13->field_2).it = 0xfffffff5;
            if ((pIVar2->field_1).o == 'R') {
              in_stack_ffffffffffffff38 =
                   (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),local_8c);
              snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,(ulong)(pIVar2->field_0).op2,
                               uVar26 + 8,in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
              pGVar9 = local_78;
              pIVar19 = local_38;
            }
            else {
              uVar3 = (&((J_00->cur).snap)->ref)[local_58 * 2];
              pIVar8 = (J_00->cur).ir;
              pIVar25 = pIVar2;
LAB_001468ac:
              pIVar10 = pIVar25;
              pIVar25 = pIVar10 + 1;
              pGVar9 = local_78;
              pIVar19 = local_38;
              if (pIVar25 < pIVar8 + uVar3) {
                if (*(char *)((long)pIVar10 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar10 + 0xf) == 0xff) {
                    uVar11 = *(byte *)((long)pIVar10 + 0xd) - 0x48;
                    if ((4 < uVar11) || (uVar11 == 2)) goto LAB_001468ac;
                    pIVar16 = (J_00->cur).ir;
                    uVar20 = (ulong)(pIVar25->field_0).op1;
                    pIVar19 = pIVar16 + uVar20;
                    if (((pIVar19->field_1).o & 0xfe) == 0x38) {
                      pIVar19 = pIVar16 + (pIVar19->field_0).op1;
                    }
                    if (pIVar16 + (pIVar19->field_0).op1 != pIVar2) goto LAB_001468ac;
                  }
                  else {
                    if (pIVar25 != pIVar2 + *(byte *)((long)pIVar10 + 0xf)) goto LAB_001468ac;
                    pIVar16 = (J_00->cur).ir;
                    uVar20 = (ulong)(pIVar25->field_0).op1;
                  }
                  uVar22 = 8;
                  if ((0x604208U >> (*(uint *)((long)pIVar10 + 0xc) & 0x1f) & 1) == 0) {
                    bVar23 = ((byte)*(uint *)((long)pIVar10 + 0xc) & 0x1f) - 0xf;
                    uVar22 = 4;
                    if (bVar23 < 4) {
                      uVar22 = *(undefined4 *)(&DAT_00160d7c + (ulong)bVar23 * 4);
                    }
                  }
                  uVar20 = (ulong)*(ushort *)((long)pIVar16 + uVar20 * 8 + 2);
                  if (*(char *)((long)pIVar16 + uVar20 * 8 + 5) == '\x1d') {
                    IVar24 = pIVar16[uVar20 + 1].i;
                  }
                  else {
                    IVar24 = pIVar16[uVar20].field_1.op12;
                  }
                  in_stack_ffffffffffffff38 =
                       (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),uVar22);
                  snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,
                                   (ulong)*(ushort *)((long)pIVar10 + 10),IVar24 + uVar26,
                                   in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
                }
                goto LAB_001468ac;
              }
            }
          }
          else {
            if ((pIVar2->field_1).o == 0x4f) {
              pGVar15 = lj_tab_new(J->L,(uint)(pIVar2->field_0).op1,(uint)(pIVar2->field_0).op2);
            }
            else {
              pGVar15 = lj_tab_dup(J->L,(GCtab *)(ulong)pIVar8[(pIVar2->field_0).op1].field_1.op12);
            }
            (pTVar13->u32).lo = (uint32_t)pGVar15;
            (pTVar13->field_2).it = 0xfffffff4;
            uVar3 = (&((J_00->cur).snap)->ref)[local_58 * 2];
            pIVar8 = (J_00->cur).ir;
            pIVar25 = pIVar2;
            pIVar10 = pIVar2;
            pGVar9 = local_78;
            pIVar19 = local_38;
joined_r0x001469f4:
            local_78 = pGVar15;
            local_38 = pIVar10;
            pIVar2 = pIVar2 + 1;
            if (pIVar2 < pIVar8 + uVar3) {
              pIVar10 = local_38;
              pGVar15 = local_78;
              pGVar9 = local_78;
              pIVar19 = local_38;
              if ((pIVar2->field_1).r == 0xfe) {
                if ((ulong)(pIVar2->field_1).s == 0xff) {
                  uVar11 = (pIVar2->field_1).o - 0x48;
                  if ((4 < uVar11) || (uVar11 == 2)) goto joined_r0x001469f4;
                  pIVar17 = (J_00->cur).ir;
                  uVar20 = (ulong)(pIVar2->field_0).op1;
                  pIVar16 = pIVar17 + uVar20;
                  bVar23 = (pIVar16->field_1).o;
                  if ((bVar23 & 0xfe) == 0x38) {
                    pIVar16 = pIVar17 + (pIVar16->field_0).op1;
                  }
                  if (pIVar17 + (pIVar16->field_0).op1 != pIVar25) goto joined_r0x001469f4;
                }
                else {
                  if (pIVar2 != pIVar25 + (pIVar2->field_1).s) goto joined_r0x001469f4;
                  pIVar17 = (J_00->cur).ir;
                  uVar20 = (ulong)(pIVar2->field_0).op1;
                  bVar23 = *(byte *)((long)pIVar17 + uVar20 * 8 + 5);
                }
                uVar4 = *(ushort *)((long)pIVar17 + uVar20 * 8 + 2);
                if (bVar23 == 0x3e) {
                  if (uVar4 == 5) {
                    if (*(char *)((long)pIVar17 + (ulong)(pIVar2->field_0).op2 * 8 + 5) == '\x1b') {
                      (local_78->metatable).gcptr32 = 0;
                    }
                    else {
                      in_stack_ffffffffffffff38 = &local_48;
                      snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,
                                      (uint)(pIVar2->field_0).op2,in_stack_ffffffffffffff38);
                      (local_78->metatable).gcptr32 = (uint32_t)local_48.field_2.field_0;
                      pIVar10 = local_38;
                      pGVar15 = local_78;
                      pGVar9 = local_78;
                      pIVar19 = local_38;
                    }
                  }
                }
                else {
                  pIVar19 = pIVar17 + uVar4;
                  if ((pIVar19->field_1).o == '\x1e') {
                    pIVar19 = pIVar17 + (pIVar19->field_0).op1;
                  }
                  lj_ir_kvalue(J->L,&local_48,pIVar19);
                  in_stack_ffffffffffffff38 = lj_tab_set(J->L,local_78,&local_48);
                  snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,
                                  (uint)(pIVar2->field_0).op2,in_stack_ffffffffffffff38);
                  pIVar25 = local_38;
                  pIVar10 = local_38;
                  pGVar15 = local_78;
                  pGVar9 = local_78;
                  pIVar19 = local_38;
                }
              }
              goto joined_r0x001469f4;
            }
          }
        }
        else {
          in_stack_ffffffffffffff38 = pTVar13;
          snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,ref,pTVar13);
          pGVar9 = local_78;
          pIVar19 = local_38;
          if ((uVar11 & 0x30000) != 0) {
            uVar26 = local_64;
            if (0xffffff < uVar11) {
              uVar26 = *local_50;
              local_50 = local_50 + -1;
            }
            (pTVar13->field_2).it = uVar26;
            local_88->base = pTVar13 + 1;
          }
        }
      }
LAB_00146b88:
      local_38 = pIVar19;
      local_78 = pGVar9;
      uVar27 = uVar27 + 1;
    } while (uVar27 != local_70);
  }
  uVar18 = (byte)*local_40 - 0x3f;
  uVar5 = uVar18 >> 1;
  if ((((uVar5 | (uint)((uVar18 & 1) != 0) << 0x1f) < 6) && ((0x27U >> (uVar5 & 0x1f) & 1) != 0)) ||
     (0x58 < (byte)*local_40)) {
    puVar21 = &local_60->nslots;
  }
  else {
    local_80 = local_88->base;
    puVar21 = (uint8_t *)((ulong)*(uint *)((ulong)local_80[-1].u32.lo + 0x10) - 0x39);
  }
  local_88->top = local_80 + *puVar21;
  J->nsnaprestore = J->nsnaprestore + 1;
  return local_40;
}

Assistant:

const BCIns *lj_snap_restore(jit_State *J, void *exptr)
{
  ExitState *ex = (ExitState *)exptr;
  SnapNo snapno = J->exitno;  /* For now, snapno == exitno. */
  GCtrace *T = traceref(J, J->parent);
  SnapShot *snap = &T->snap[snapno];
  MSize n, nent = snap->nent;
  SnapEntry *map = &T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &T->snapmap[snap_nextofs(T, snap)-1-LJ_FR2];
#endif
#if !LJ_FR2
  ptrdiff_t ftsz0;
#endif
  TValue *frame;
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  const BCIns *pc = snap_pc(&map[nent]);
  lua_State *L = J->L;

  /* Set interpreter PC to the next PC to get correct error messages. */
  setcframe_pc(cframe_raw(L->cframe), pc+1);

  /* Make sure the stack is big enough for the slots from the snapshot. */
  if (LJ_UNLIKELY(L->base + snap->topslot >= tvref(L->maxstack))) {
    L->top = curr_topL(L);
    lj_state_growstack(L, snap->topslot - curr_proto(L)->framesize);
  }

  /* Fill stack slots with data from the registers and spill slots. */
  frame = L->base-1-LJ_FR2;
#if !LJ_FR2
  ftsz0 = frame_ftsz(frame);  /* Preserve link to previous frame in slot #0. */
#endif
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    if (!(sn & SNAP_NORESTORE)) {
      TValue *o = &frame[snap_slot(sn)];
      IRRef ref = snap_ref(sn);
      IRIns *ir = &T->ir[ref];
      if (ir->r == RID_SUNK) {
	MSize j;
	for (j = 0; j < n; j++)
	  if (snap_ref(map[j]) == ref) {  /* De-duplicate sunk allocations. */
	    copyTV(L, o, &frame[snap_slot(map[j])]);
	    goto dupslot;
	  }
	snap_unsink(J, T, ex, snapno, rfilt, ir, o);
      dupslot:
	continue;
      }
      snap_restoreval(J, T, ex, snapno, rfilt, ref, o);
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM) && tvisint(o)) {
	TValue tmp;
	snap_restoreval(J, T, ex, snapno, rfilt, ref+1, &tmp);
	o->u32.hi = tmp.u32.lo;
#if !LJ_FR2
      } else if ((sn & (SNAP_CONT|SNAP_FRAME))) {
	/* Overwrite tag with frame link. */
	setframe_ftsz(o, snap_slot(sn) != 0 ? (int32_t)*flinks-- : ftsz0);
	L->base = o+1;
#endif
      }
    }
  }
#if LJ_FR2
  L->base += (map[nent+LJ_BE] & 0xff);
#endif
  lj_assertJ(map + nent == flinks, "inconsistent frames in snapshot");

  /* Compute current stack top. */
  switch (bc_op(*pc)) {
  default:
    if (bc_op(*pc) < BC_FUNCF) {
      L->top = curr_topL(L);
      break;
    }
    /* fallthrough */
  case BC_CALLM: case BC_CALLMT: case BC_RETM: case BC_TSETM:
    L->top = frame + snap->nslots;
    break;
  }
  J->nsnaprestore++;
  return pc;
}